

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_extrh_i64_i32_mips(TCGContext_conflict3 *tcg_ctx,TCGv_i32 ret,TCGv_i64 arg)

{
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  
  pTVar1 = tcg_emit_op_mips(tcg_ctx,INDEX_op_extrh_i64_i32);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_extrh_i64_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i64 arg)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_mov_i32(tcg_ctx, ret, TCGV_HIGH(tcg_ctx, arg));
#elif TCG_TARGET_HAS_extrh_i64_i32
        tcg_gen_op2(tcg_ctx, INDEX_op_extrh_i64_i32,
                    tcgv_i32_arg(tcg_ctx, ret), tcgv_i64_arg(tcg_ctx, arg));
#else
        TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_shri_i64(tcg_ctx, t, arg, 32);
        tcg_gen_mov_i32(tcg_ctx, ret, (TCGv_i32)t);
        tcg_temp_free_i64(tcg_ctx, t);
#endif
}